

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O3

void __thiscall Js::StringProfiler::PrintAll(StringProfiler *this)

{
  Type pSVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 uVar6;
  Type piVar7;
  Type pSVar8;
  undefined4 uVar10;
  Type pSVar9;
  KeyValueEntry<unsigned_int,_Js::StringProfiler::StringMetrics> *pKVar11;
  bool bVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 local_68 [8];
  HistogramIndex index;
  StringMetrics metrics;
  double local_40;
  uint local_34 [2];
  uint length;
  
  uVar21 = 0;
  Output::Print(L"=============================================================\n");
  Output::Print(L"String Statistics\n");
  Output::Print(L"-------------------------------------------------------------\n");
  Output::Print(L"    Length 7bit ASCII 8bit ASCII    Unicode      Total %%Total\n");
  Output::Print(L" --------- ---------- ---------- ---------- ---------- ------\n");
  HistogramIndex::HistogramIndex
            ((HistogramIndex *)local_68,&this->allocator,
             (this->stringLengthMetrics).count - (this->stringLengthMetrics).freeCount);
  uVar15 = (ulong)(this->stringLengthMetrics).bucketCount;
  uVar13 = (uint)index.index;
  if (uVar15 == 0) {
    local_40 = 0.0;
  }
  else {
    piVar7 = (this->stringLengthMetrics).buckets;
    pSVar8 = (this->stringLengthMetrics).entries;
    uVar16 = 0;
    do {
      iVar17 = piVar7[uVar16];
      while (iVar17 != -1) {
        iVar2 = pSVar8[iVar17].
                super_DefaultHashedEntry<unsigned_int,_Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<unsigned_int,_Js::StringProfiler::StringMetrics>.
                super_ValueEntry<Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>_>
                .super_KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>.
                next;
        pKVar11 = &pSVar8[iVar17].
                   super_DefaultHashedEntry<unsigned_int,_Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<unsigned_int,_Js::StringProfiler::StringMetrics>;
        uVar6 = (pKVar11->
                super_ValueEntry<Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>_>
                ).super_KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>.
                value.count7BitASCII;
        uVar10 = (pKVar11->
                 super_ValueEntry<Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>_>
                 ).super_KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>.
                 value.count8BitASCII;
        uVar18 = pSVar8[iVar17].
                 super_DefaultHashedEntry<unsigned_int,_Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                 .super_KeyValueEntry<unsigned_int,_Js::StringProfiler::StringMetrics>.
                 super_ValueEntry<Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>_>
                 .super_KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>.
                 value.countUnicode + uVar6 + uVar10;
        ((UintUintPair *)((long)local_68 + (ulong)uVar13 * 8))->first =
             pSVar8[iVar17].
             super_DefaultHashedEntry<unsigned_int,_Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
             .super_KeyValueEntry<unsigned_int,_Js::StringProfiler::StringMetrics>.
             super_ValueEntry<Js::StringProfiler::StringMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>_>
             .super_KeyValueEntryDataLayout2<unsigned_int,_Js::StringProfiler::StringMetrics>.key;
        ((UintUintPair *)((long)local_68 + (ulong)uVar13 * 8))->second = uVar18;
        uVar13 = uVar13 + 1;
        uVar21 = uVar21 + uVar18;
        iVar17 = iVar2;
        index.index._0_4_ = uVar13;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar15);
    local_40 = (double)uVar21;
  }
  qsort((void *)local_68,(ulong)uVar13,8,HistogramIndex::CompareDescending);
  if ((uint)index.index == 0) {
    uVar13 = 0;
    uVar22 = 0;
    uVar19 = 0;
    uVar21 = 0;
  }
  else {
    uVar18 = 0;
    uVar21 = 0;
    uVar19 = 0;
    uVar22 = 0;
    uVar13 = 0;
    do {
      local_34[0] = HistogramIndex::Get((HistogramIndex *)local_68,uVar18);
      bVar12 = JsUtil::
               BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::TryGetValue<unsigned_int>
                         (&this->stringLengthMetrics,local_34,(StringMetrics *)&index.count);
      if (bVar12) {
        Output::Print(L"%10u %10u %10u %10u %10u (%.1f%%)\n",
                      ((double)(metrics.count7BitASCII + index.count + index._12_4_) * 100.0) /
                      local_40,(ulong)local_34[0]);
        uVar21 = uVar21 + index.count;
        uVar19 = uVar19 + index._12_4_;
        uVar22 = uVar22 + metrics.count7BitASCII;
        if (uVar13 <= local_34[0]) {
          uVar13 = local_34[0];
        }
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 != (uint)index.index);
  }
  Output::Print(L"-------------------------------------------------------------\n");
  Output::Print(L"    Totals %10u %10u %10u %10u (100%%)\n",(ulong)uVar21,(ulong)uVar19,
                (ulong)uVar22,(ulong)(uVar22 + uVar19 + uVar21));
  if (this->discardedWrongThread != 0) {
    Output::Print(
                 L"WARNING: %u strings were not counted because they were allocated on a background thread\n"
                 );
  }
  Output::Print(L"\n");
  Output::Print(L"Max string length is %u chars\n",(ulong)uVar13);
  Output::Print(L"%u empty strings (Literals or BufferString) were requested\n",
                (ulong)this->emptyStrings);
  Output::Print(L"%u single char strings (Literals or BufferString) were requested\n",
                (ulong)this->singleCharStrings);
  if (this->embeddedNULStrings == 0) {
    Output::Print(L"No embedded NULs were detected\n");
  }
  else {
    Output::Print(L"Embedded NULs: %u NULs in %u strings\n",(ulong)this->embeddedNULChars);
  }
  uVar13 = 0;
  Output::Print(L"\n");
  if ((this->stringConcatMetrics).count == (this->stringConcatMetrics).freeCount) {
    Output::Print(L"No string concatenations were performed\n");
  }
  else {
    Output::Print(L"String concatenations (Strings %u chars or longer are treated as \"Large\")\n");
    Output::Print(L"   LHS +  RHS  SB    Concat   Buf  Other  Total\n");
    Output::Print(L"------ ------ ------ ------ ------ ------ ------\n");
    uVar21 = (this->stringConcatMetrics).bucketCount;
    uVar22 = 0;
    uVar20 = 0;
    uVar15 = 0;
    uVar19 = 0;
    if (uVar21 != 0) {
      uVar13 = 0;
      uVar22 = 0;
      uVar20 = 0;
      uVar15 = 0;
      uVar19 = 0;
      uVar16 = 0;
      do {
        iVar17 = (this->stringConcatMetrics).buckets[uVar16];
        if (iVar17 != -1) {
          do {
            pSVar9 = (this->stringConcatMetrics).entries;
            lVar14 = (long)iVar17;
            pSVar1 = pSVar9 + iVar17;
            iVar17 = (pSVar1->
                     super_DefaultHashedEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     ).
                     super_KeyValueEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                     .
                     super_ValueEntry<Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>_>
                     .
                     super_KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                     .next;
            PrintOneConcat(&(pSVar1->
                            super_DefaultHashedEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                            ).
                            super_KeyValueEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                            .
                            super_ValueEntry<Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>_>
                            .
                            super_KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                            .key,(ConcatMetrics *)(pSVar9 + lVar14));
            uVar18 = (pSVar1->
                     super_DefaultHashedEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                     ).
                     super_KeyValueEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                     .
                     super_ValueEntry<Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>_>
                     .
                     super_KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                     .value.compoundStringCount;
            uVar3 = (pSVar1->
                    super_DefaultHashedEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    ).
                    super_KeyValueEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                    .
                    super_ValueEntry<Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>_>
                    .
                    super_KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                    .value.concatTreeCount;
            uVar4 = (pSVar1->
                    super_DefaultHashedEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    ).
                    super_KeyValueEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                    .
                    super_ValueEntry<Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>_>
                    .
                    super_KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                    .value.bufferStringBuilderCount;
            uVar5 = (pSVar1->
                    super_DefaultHashedEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                    ).
                    super_KeyValueEntry<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                    .
                    super_ValueEntry<Js::StringProfiler::ConcatMetrics,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>_>
                    .
                    super_KeyValueEntryDataLayout2<Js::StringProfiler::UintUintPair,_Js::StringProfiler::ConcatMetrics>
                    .value.unknownCount;
            uVar13 = uVar13 + uVar18 + uVar3 + uVar4 + uVar5;
            uVar22 = uVar22 + uVar3;
            uVar20 = uVar20 + uVar4;
            uVar15 = (ulong)((int)uVar15 + uVar18);
            uVar19 = uVar19 + uVar5;
          } while (iVar17 != -1);
          uVar21 = (this->stringConcatMetrics).bucketCount;
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 < uVar21);
    }
    Output::Print(L"-------------------------------------------------------\n");
    Output::Print(L"Total %6u %6u %6u %6u %6u\n",(ulong)uVar13,uVar15,(ulong)uVar22,(ulong)uVar20,
                  (ulong)uVar19);
  }
  Output::Flush();
  return;
}

Assistant:

void StringProfiler::PrintAll()
    {
        Output::Print(_u("=============================================================\n"));
        Output::Print(_u("String Statistics\n"));
        Output::Print(_u("-------------------------------------------------------------\n"));
        Output::Print(_u("    Length 7bit ASCII 8bit ASCII    Unicode      Total %%Total\n"));
        Output::Print(_u(" --------- ---------- ---------- ---------- ---------- ------\n"));

        // Build an index for printing the histogram in descending order
        HistogramIndex index(&allocator, stringLengthMetrics.Count());
        uint totalStringCount = 0;
        stringLengthMetrics.Map([this, &index, &totalStringCount](unsigned int len, StringMetrics metrics)
        {
            uint lengthTotal = metrics.Total();
            index.Add(len, lengthTotal);
            totalStringCount += lengthTotal;
        });
        index.SortDescending();

        StringMetrics cumulative = {};
        uint maxLength = 0;

        for(uint i = 0; i != index.Count(); ++i )
        {
            uint length = index.Get(i);

            // UintHashMap::Lookup doesn't work with value-types (it returns NULL
            // on error), so use TryGetValue instead.
            StringMetrics metrics;
            if( stringLengthMetrics.TryGetValue(length, &metrics) )
            {
                PrintOne( length, metrics, totalStringCount );

                cumulative.Accumulate(metrics);
                maxLength = max( maxLength, length );
            }
        }

        Output::Print(_u("-------------------------------------------------------------\n"));
        Output::Print(_u("    Totals %10u %10u %10u %10u (100%%)\n"),
            cumulative.count7BitASCII,
            cumulative.count8BitASCII,
            cumulative.countUnicode,
            cumulative.Total() );

        if(discardedWrongThread>0)
        {
            Output::Print(_u("WARNING: %u strings were not counted because they were allocated on a background thread\n"),discardedWrongThread);
        }
        Output::Print(_u("\n"));
        Output::Print(_u("Max string length is %u chars\n"), maxLength);
        Output::Print(_u("%u empty strings (Literals or BufferString) were requested\n"), emptyStrings);
        Output::Print(_u("%u single char strings (Literals or BufferString) were requested\n"), singleCharStrings);
        if( this->embeddedNULStrings == 0 )
        {
            Output::Print(_u("No embedded NULs were detected\n"));
        }
        else
        {
            Output::Print(_u("Embedded NULs: %u NULs in %u strings\n"), this->embeddedNULChars, this->embeddedNULStrings);
        }
        Output::Print(_u("\n"));

        if(stringConcatMetrics.Count() == 0)
        {
            Output::Print(_u("No string concatenations were performed\n"));
        }
        else
        {
            Output::Print(_u("String concatenations (Strings %u chars or longer are treated as \"Large\")\n"), k_MaxConcatLength);
            Output::Print(_u("   LHS +  RHS  SB    Concat   Buf  Other  Total\n"));
            Output::Print(_u("------ ------ ------ ------ ------ ------ ------\n"));

            uint totalConcatenations = 0;
            uint totalConcatTree = 0;
            uint totalBufString = 0;
            uint totalCompoundString = 0;
            uint totalOther = 0;
            stringConcatMetrics.Map([&](UintUintPair const& key, const ConcatMetrics& metrics)
            {
                PrintOneConcat(key, metrics);
                totalConcatenations += metrics.Total();
                totalConcatTree += metrics.concatTreeCount;
                totalBufString += metrics.bufferStringBuilderCount;
                totalCompoundString += metrics.compoundStringCount;
                totalOther += metrics.unknownCount;
            }
            );
            Output::Print(_u("-------------------------------------------------------\n"));
            Output::Print(_u("Total %6u %6u %6u %6u %6u\n"), totalConcatenations, totalCompoundString, totalConcatTree, totalBufString, totalOther);
        }

        Output::Flush();
    }